

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall
icu_63::RBBITableBuilder::setAdd(RBBITableBuilder *this,UVector *dest,UVector *source)

{
  void **ppvVar1;
  void *obj;
  void *obj_00;
  int iVar2;
  void **ppvVar3;
  void **ppvVar4;
  void **result;
  int iVar5;
  MaybeStackArray<void_*,_16> sourceArray;
  MaybeStackArray<void_*,_16> destArray;
  
  iVar5 = dest->count;
  iVar2 = source->count;
  destArray.ptr = destArray.stackArray;
  sourceArray.capacity = 0x10;
  destArray.needToRelease = '\0';
  sourceArray.ptr = sourceArray.stackArray;
  sourceArray.needToRelease = '\0';
  destArray.capacity = sourceArray.capacity;
  if ((((long)iVar5 < 0x11) ||
      (ppvVar3 = MaybeStackArray<void_*,_16>::resize(&destArray,iVar5,0), ppvVar3 != (void **)0x0))
     && ((ppvVar3 = destArray.ptr, iVar2 <= sourceArray.capacity ||
         (ppvVar4 = MaybeStackArray<void_*,_16>::resize(&sourceArray,iVar2,0),
         ppvVar4 != (void **)0x0)))) {
    result = sourceArray.ptr;
    UVector::toArray(dest,ppvVar3);
    UVector::toArray(source,result);
    UVector::setSize(dest,iVar5 + iVar2,this->fStatus);
    ppvVar4 = ppvVar3 + iVar5;
    ppvVar1 = result + iVar2;
    iVar5 = 0;
    while ((result < ppvVar1 && (ppvVar3 < ppvVar4))) {
      obj = *ppvVar3;
      obj_00 = *result;
      if (obj == obj_00) {
        UVector::setElementAt(dest,obj_00,iVar5);
        result = result + 1;
LAB_0029402c:
        ppvVar3 = ppvVar3 + 1;
      }
      else {
        iVar2 = memcmp(ppvVar3,result,8);
        if (iVar2 < 0) {
          UVector::setElementAt(dest,obj,iVar5);
          goto LAB_0029402c;
        }
        UVector::setElementAt(dest,obj_00,iVar5);
        result = result + 1;
      }
      iVar5 = iVar5 + 1;
    }
    for (; ppvVar3 < ppvVar4; ppvVar3 = ppvVar3 + 1) {
      UVector::setElementAt(dest,*ppvVar3,iVar5);
      iVar5 = iVar5 + 1;
    }
    for (; result < ppvVar1; result = result + 1) {
      UVector::setElementAt(dest,*result,iVar5);
      iVar5 = iVar5 + 1;
    }
    UVector::setSize(dest,iVar5,this->fStatus);
  }
  MaybeStackArray<void_*,_16>::~MaybeStackArray(&sourceArray);
  MaybeStackArray<void_*,_16>::~MaybeStackArray(&destArray);
  return;
}

Assistant:

void RBBITableBuilder::setAdd(UVector *dest, UVector *source) {
    int32_t destOriginalSize = dest->size();
    int32_t sourceSize       = source->size();
    int32_t di           = 0;
    MaybeStackArray<void *, 16> destArray, sourceArray;  // Handle small cases without malloc
    void **destPtr, **sourcePtr;
    void **destLim, **sourceLim;

    if (destOriginalSize > destArray.getCapacity()) {
        if (destArray.resize(destOriginalSize) == NULL) {
            return;
        }
    }
    destPtr = destArray.getAlias();
    destLim = destPtr + destOriginalSize;  // destArray.getArrayLimit()?

    if (sourceSize > sourceArray.getCapacity()) {
        if (sourceArray.resize(sourceSize) == NULL) {
            return;
        }
    }
    sourcePtr = sourceArray.getAlias();
    sourceLim = sourcePtr + sourceSize;  // sourceArray.getArrayLimit()?

    // Avoid multiple "get element" calls by getting the contents into arrays
    (void) dest->toArray(destPtr);
    (void) source->toArray(sourcePtr);

    dest->setSize(sourceSize+destOriginalSize, *fStatus);

    while (sourcePtr < sourceLim && destPtr < destLim) {
        if (*destPtr == *sourcePtr) {
            dest->setElementAt(*sourcePtr++, di++);
            destPtr++;
        }
        // This check is required for machines with segmented memory, like i5/OS.
        // Direct pointer comparison is not recommended.
        else if (uprv_memcmp(destPtr, sourcePtr, sizeof(void *)) < 0) {
            dest->setElementAt(*destPtr++, di++);
        }
        else { /* *sourcePtr < *destPtr */
            dest->setElementAt(*sourcePtr++, di++);
        }
    }

    // At most one of these two cleanup loops will execute
    while (destPtr < destLim) {
        dest->setElementAt(*destPtr++, di++);
    }
    while (sourcePtr < sourceLim) {
        dest->setElementAt(*sourcePtr++, di++);
    }

    dest->setSize(di, *fStatus);
}